

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar1 = (state->cur_)._M_current;
  pcVar5 = *(char **)this;
  pcVar2 = *(char **)(this + 0x20);
  pcVar6 = pcVar1;
  do {
    if (pcVar5 == pcVar2) {
      iVar4 = (*(next->
                super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_matchable[2])(next,state);
      bVar3 = true;
      if ((char)iVar4 == '\0') {
LAB_00126901:
        (state->cur_)._M_current = pcVar1;
        bVar3 = false;
      }
      return bVar3;
    }
    if (pcVar6 == (state->end_)._M_current) {
      state->found_partial_match_ = true;
      goto LAB_00126901;
    }
    if (*pcVar6 != *pcVar5) goto LAB_00126901;
    pcVar5 = pcVar5 + 1;
    pcVar6 = pcVar6 + 1;
    (state->cur_)._M_current = pcVar6;
  } while( true );
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            BidiIter const tmp = state.cur_;
            char_type const *begin = detail::data_begin(this->str_);
            for(; begin != this->end_; ++begin, ++state.cur_)
            {
                if(state.eos() ||
                    (detail::translate(*state.cur_, traits_cast<Traits>(state), icase_type()) != *begin))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            if(next.match(state))
            {
                return true;
            }

            state.cur_ = tmp;
            return false;
        }